

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

string * __thiscall soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,Function *f)

{
  soul *this_00;
  ArrayWithPreallocation<soul::Identifier,_8UL> *pAVar1;
  long *plVar2;
  long *plVar3;
  uint64_t *puVar4;
  string_view name;
  IdentifierPath parentPath;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  string local_1c8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1a8;
  string local_150;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_130;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_d8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_80;
  
  plVar2 = (long *)(**(code **)(*(long *)this + 0x18))(this);
  if (plVar2 == (long *)0x0) {
    plVar2 = *(long **)(this + 0x38);
    if (plVar2 == (long *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,*plVar2,plVar2[1] + *plVar2);
    goto LAB_001bf62a;
  }
  local_130.numActive = 0;
  local_130.numAllocated = 8;
  local_130.items = (Identifier *)local_130.space;
  plVar3 = (long *)(**(code **)(*plVar2 + 0x40))(plVar2);
  if (plVar3 == (long *)0x0) {
    (**(code **)(*plVar2 + 0x10))(&local_1a8,plVar2);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_130,&local_1a8);
    local_1a8.numActive = 0;
    if (8 < local_1a8.numAllocated) {
      if (local_1a8.items != (Identifier *)0x0) {
        operator_delete__(local_1a8.items);
      }
      pAVar1 = &local_1a8;
      goto LAB_001bf503;
    }
  }
  else {
    plVar2 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3);
    (**(code **)(*plVar2 + 0x10))(&local_80,plVar2);
    IdentifierPath::IdentifierPath
              ((IdentifierPath *)&local_1a8,(IdentifierPath *)&local_80,(string *)plVar3[7]);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_130,&local_1a8);
    local_1a8.numActive = 0;
    if (8 < local_1a8.numAllocated) {
      if (local_1a8.items != (Identifier *)0x0) {
        operator_delete__(local_1a8.items);
      }
      local_1a8.items = (Identifier *)local_1a8.space;
      local_1a8.numAllocated = 8;
    }
    local_80.numActive = 0;
    if (8 < local_80.numAllocated) {
      if (local_80.items != (Identifier *)0x0) {
        operator_delete__(local_80.items);
      }
      pAVar1 = &local_80;
LAB_001bf503:
      puVar4 = pAVar1->space;
      ((ArrayWithPreallocation<soul::Identifier,_8UL> *)(puVar4 + -3))->items = (Identifier *)puVar4
      ;
      puVar4[-1] = 8;
    }
  }
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_d8,&local_130);
  IdentifierPath::IdentifierPath
            ((IdentifierPath *)&local_1a8,(IdentifierPath *)&local_d8,*(string **)(this + 0x38));
  IdentifierPath::toString_abi_cxx11_(&local_150,(IdentifierPath *)&local_1a8);
  Program::stripRootNamespaceFromQualifiedPath(&local_1c8,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_1a8.numActive = 0;
  if (8 < local_1a8.numAllocated) {
    if (local_1a8.items != (Identifier *)0x0) {
      operator_delete__(local_1a8.items);
    }
    local_1a8.items = (Identifier *)local_1a8.space;
    local_1a8.numAllocated = 8;
  }
  local_d8.numActive = 0;
  if (8 < local_d8.numAllocated) {
    if (local_d8.items != (Identifier *)0x0) {
      operator_delete__(local_d8.items);
    }
    local_d8.items = (Identifier *)local_d8.space;
    local_d8.numAllocated = 8;
  }
  local_130.numActive = 0;
  if (8 < local_130.numAllocated) {
    if (local_130.items != (Identifier *)0x0) {
      operator_delete__(local_130.items);
    }
    local_130.numAllocated = 8;
    local_130.items = (Identifier *)local_130.space;
  }
LAB_001bf62a:
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x289120);
  name._M_str = plVar2 + 2;
  if ((long *)*plVar2 == name._M_str) {
    local_1d8 = *name._M_str;
    lStack_1d0 = plVar2[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *name._M_str;
    local_1e8 = (long *)*plVar2;
  }
  this_00 = (soul *)plVar2[1];
  *plVar2 = (long)name._M_str;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  name._M_len = (size_t)local_1e8;
  makeUID_abi_cxx11_(__return_storage_ptr__,this_00,name);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::Function& f)               { return makeUID ("fn_" + getFullPathForASTObject (f)); }